

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.hpp
# Opt level: O2

uint Lib::StackHash<Lib::StlHash>::
     hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
               (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s,
               uint hash)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  uint uVar2;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *x;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *self;
  
  pMVar1 = s->_cursor;
  for (self = s->_stack; self != pMVar1; self = self + 1) {
    uVar2 = StlHash::hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
                      (self);
    hash = hash ^ uVar2 + (hash >> 2) + hash * 0x40 + 0x9e3779b9;
  }
  return hash;
}

Assistant:

static unsigned hash(const Stack<T>& s, unsigned hash = FNV32_OFFSET_BASIS) {
    for (auto& x : s) {
      hash = HashUtils::combine(hash, ElementHash::hash(x));
    }
    return hash;
  }